

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_benchmark.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_b963::read_iostream_range
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          char *file_name)

{
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  allocator_type local_221;
  ifstream file;
  undefined8 auStack_138 [36];
  
  std::ifstream::ifstream(&file);
  std::ios::exceptions((int)&file + (int)*(undefined8 *)(_file + -0x18));
  std::ifstream::open((char *)&file,(_Ios_Openmode)file_name);
  __first._8_8_ = 0xffffffffffffffff;
  __first._M_sbuf = *(streambuf_type **)((long)auStack_138 + *(long *)(_file + -0x18));
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,__first,
             (istreambuf_iterator<char,_std::char_traits<char>_>)(ZEXT816(0xffffffff) << 0x40),
             &local_221);
  std::ifstream::~ifstream(&file);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::uint8_t> read_iostream_range(const char* file_name)
{
    std::ifstream file{};
    file.exceptions(std::ios::badbit);
    file.open(file_name, std::ios_base::binary);

    return std::vector<uint8_t>(std::istreambuf_iterator<char>(file),
                                std::istreambuf_iterator<char>());
}